

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,SchnorrPubkey *schnorr_pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this->key_type_ = kDescriptorKeySchnorr;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)schnorr_pubkey);
  Pubkey::Pubkey(&this->pubkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  (this->argument_)._M_dataplus._M_p = (pointer)&(this->argument_).field_2;
  (this->argument_)._M_string_length = 0;
  (this->argument_).field_2._M_local_buf[0] = '\0';
  SchnorrPubkey::CreatePubkey((Pubkey *)&local_48,schnorr_pubkey,false);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,&local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const SchnorrPubkey& schnorr_pubkey)
    : key_type_(DescriptorKeyType::kDescriptorKeySchnorr),
      schnorr_pubkey_(schnorr_pubkey) {
  pubkey_ = schnorr_pubkey.CreatePubkey();
}